

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::Transformations::Transformations(Transformations *this,Transformations *param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar4;
  undefined8 uVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  
  this->time_range = param_1->time_range;
  (this->spaces).size_active = (param_1->spaces).size_active;
  sVar3 = (param_1->spaces).size_alloced;
  (this->spaces).size_alloced = sVar3;
  pAVar6 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar3 << 6,0x10);
  (this->spaces).items = pAVar6;
  lVar7 = 0x30;
  for (uVar8 = 0; uVar8 < (this->spaces).size_active; uVar8 = uVar8 + 1) {
    pAVar6 = (this->spaces).items;
    pAVar4 = (param_1->spaces).items;
    puVar1 = (undefined8 *)((long)pAVar4 + lVar7 + -0x30);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)pAVar6 + lVar7 + -0x30);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    puVar1 = (undefined8 *)((long)pAVar4 + lVar7 + -0x20);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)pAVar6 + lVar7 + -0x20);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    puVar1 = (undefined8 *)((long)pAVar4 + lVar7 + -0x10);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)pAVar6 + lVar7 + -0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    puVar1 = (undefined8 *)((long)&(pAVar4->l).vx.field_0 + lVar7);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(pAVar6->l).vx.field_0 + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar7 = lVar7 + 0x40;
  }
  this->quaternion = param_1->quaternion;
  return;
}

Assistant:

__forceinline Transformations() {}